

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.h
# Opt level: O0

void __thiscall
slang::ast::GenericClassDefSymbol::GenericClassDefSymbol
          (GenericClassDefSymbol *this,string_view name,SourceLocation loc,
          function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&)> specializeFunc)

{
  GenericClassDefSymbol *this_local;
  function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&)> specializeFunc_local;
  SourceLocation loc_local;
  string_view name_local;
  
  Symbol::Symbol(&this->super_Symbol,GenericClassDef,name,loc);
  this->isInterface = false;
  SmallVector<slang::ast::Definition::ParameterDecl,_8UL>::SmallVector(&this->paramDecls);
  ska::
  flat_hash_map<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*,_slang::ast::GenericClassDefSymbol::Hasher,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>
  ::flat_hash_map(&this->specMap);
  std::optional<const_slang::ast::Type_*>::optional(&this->defaultSpecialization);
  this->firstForward = (ForwardingTypedefSymbol *)0x0;
  (this->specializeFunc).callback = specializeFunc.callback;
  (this->specializeFunc).callable = specializeFunc.callable;
  return;
}

Assistant:

GenericClassDefSymbol(string_view name, SourceLocation loc,
                          function_ref<void(Compilation&, ClassType&)> specializeFunc) :
        Symbol(SymbolKind::GenericClassDef, name, loc),
        specializeFunc{specializeFunc} {}